

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O3

int __thiscall
ncnn::Gemm::forward(Gemm *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  float fVar2;
  size_t sVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  size_t sVar16;
  size_t sVar17;
  undefined8 __ptr;
  int iVar18;
  size_t *psVar19;
  int iVar20;
  void *pvVar21;
  int iVar22;
  size_t *psVar23;
  float *pfVar24;
  ulong uVar25;
  pointer pMVar26;
  Mat *pMVar27;
  int iVar28;
  pointer pMVar29;
  int iVar30;
  long lVar31;
  uint uVar32;
  long lVar33;
  int *piVar34;
  undefined4 *puVar35;
  ulong uVar36;
  Allocator **ppAVar37;
  Mat *pMVar38;
  Allocator *pAVar39;
  uint uVar40;
  void *pvVar41;
  float fVar42;
  undefined1 local_148 [12];
  ulong local_130;
  Mat local_118;
  Mat local_c8;
  long local_80;
  Allocator *local_78;
  size_t *local_70;
  int *local_68;
  long local_60;
  void *local_58;
  void *local_50;
  Mat *local_48;
  ulong local_40;
  float *local_38;
  
  if (this->int8_scale_term != 0) {
    iVar18 = forward_int8(this,bottom_blobs,top_blobs,opt);
    return iVar18;
  }
  if (this->constantA == 0) {
    pMVar38 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (this->constantB != 0) goto LAB_00468c60;
    pMVar27 = pMVar38 + 1;
  }
  else {
    pMVar38 = &this->A_data;
    if (this->constantB == 0) {
      pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    else {
LAB_00468c60:
      pMVar27 = &this->B_data;
    }
  }
  sVar3 = pMVar38->elemsize;
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize = 0;
  local_c8.elempack = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  if (this->transA == 0) {
    if (&local_c8 != pMVar38) {
      piVar34 = pMVar38->refcount;
      if (piVar34 != (int *)0x0) {
        LOCK();
        *piVar34 = *piVar34 + 1;
        UNLOCK();
      }
      local_c8.data = pMVar38->data;
      local_c8.refcount._0_4_ = SUB84(pMVar38->refcount,0);
      local_c8.refcount._4_4_ = (undefined4)((ulong)pMVar38->refcount >> 0x20);
      local_c8.elemsize = pMVar38->elemsize;
      local_c8.elempack = pMVar38->elempack;
      local_c8.allocator = pMVar38->allocator;
      uVar4 = pMVar38->dims;
      uVar5 = pMVar38->w;
      uVar6 = pMVar38->h;
      uVar7 = pMVar38->d;
      local_c8.w = uVar5;
      local_c8.h = uVar6;
      local_c8.d = uVar7;
      local_c8.c = pMVar38->c;
      local_c8.cstep = pMVar38->cstep;
      local_c8.dims = uVar4;
    }
  }
  else {
    Mat::create(&local_c8,(&pMVar38->h)[(ulong)(pMVar38->dims == 3) * 2],pMVar38->w,sVar3,
                opt->workspace_allocator);
    if (pMVar38->dims == 3) {
      iVar18 = (int)pMVar38->cstep;
    }
    else {
      iVar18 = pMVar38->w;
    }
    if (0 < (long)local_c8.h) {
      lVar31 = 0;
      lVar33 = 0;
      pvVar21 = local_c8.data;
      do {
        if (0 < local_c8.w) {
          puVar35 = (undefined4 *)((long)pMVar38->data + lVar31);
          uVar36 = 0;
          do {
            *(undefined4 *)((long)pvVar21 + uVar36 * 4) = *puVar35;
            uVar36 = uVar36 + 1;
            puVar35 = puVar35 + iVar18;
          } while ((uint)local_c8.w != uVar36);
        }
        lVar33 = lVar33 + 1;
        lVar31 = lVar31 + 4;
        pvVar21 = (void *)((long)pvVar21 + (long)local_c8.w * local_c8.elemsize);
      } while (lVar33 != local_c8.h);
    }
  }
  local_118.cstep = 0;
  local_118.data = (void *)0x0;
  local_118.refcount._0_4_ = 0;
  local_118.refcount._4_4_ = 0;
  local_118.elemsize = 0;
  local_118.elempack = 0;
  local_118.allocator = (Allocator *)0x0;
  local_118.dims = 0;
  local_118.w = 0;
  local_118.h = 0;
  local_118.d = 0;
  local_118.c = 0;
  if (this->transB == 0) {
    Mat::create(&local_118,(&pMVar27->h)[(ulong)(pMVar27->dims == 3) * 2],pMVar27->w,sVar3,
                opt->workspace_allocator);
    if (pMVar27->dims == 3) {
      iVar18 = (int)pMVar27->cstep;
    }
    else {
      iVar18 = pMVar27->w;
    }
    iVar20 = local_118.h;
    if (0 < (long)local_118.h) {
      lVar31 = 0;
      lVar33 = 0;
      pvVar21 = local_118.data;
      do {
        if (0 < local_118.w) {
          puVar35 = (undefined4 *)((long)pMVar27->data + lVar31);
          uVar36 = 0;
          do {
            *(undefined4 *)((long)pvVar21 + uVar36 * 4) = *puVar35;
            uVar36 = uVar36 + 1;
            puVar35 = puVar35 + iVar18;
          } while ((uint)local_118.w != uVar36);
        }
        lVar33 = lVar33 + 1;
        lVar31 = lVar31 + 4;
        pvVar21 = (void *)((long)pvVar21 + (long)local_118.w * local_118.elemsize);
      } while (lVar33 != local_118.h);
    }
  }
  else if (&local_118 == pMVar27) {
    iVar20 = 0;
  }
  else {
    piVar34 = pMVar27->refcount;
    if (piVar34 != (int *)0x0) {
      LOCK();
      *piVar34 = *piVar34 + 1;
      UNLOCK();
    }
    local_118.data = pMVar27->data;
    local_118.refcount._0_4_ = SUB84(pMVar27->refcount,0);
    local_118.refcount._4_4_ = (undefined4)((ulong)pMVar27->refcount >> 0x20);
    local_118.elemsize = pMVar27->elemsize;
    local_118.elempack = pMVar27->elempack;
    local_118.allocator = pMVar27->allocator;
    uVar8 = pMVar27->dims;
    uVar9 = pMVar27->w;
    uVar10 = pMVar27->h;
    uVar11 = pMVar27->d;
    local_118.w = uVar9;
    local_118.h = uVar10;
    local_118.d = uVar11;
    local_118.c = pMVar27->c;
    local_118.cstep = pMVar27->cstep;
    iVar20 = pMVar27->h;
    local_118.dims = uVar8;
  }
  if (local_118.dims == 3) {
    iVar20 = local_118.c;
  }
  iVar18 = (&local_c8.h)[(ulong)(local_c8.dims == 3) * 2];
  if (this->constantC != 0) {
    piVar34 = (this->C_data).refcount;
    if (piVar34 != (int *)0x0) {
      LOCK();
      *piVar34 = *piVar34 + 1;
      UNLOCK();
    }
    auVar12._0_8_ = (this->C_data).data;
    auVar12._8_8_ = (this->C_data).refcount;
    local_148 = auVar12._0_12_;
    pAVar39 = (this->C_data).allocator;
    uVar32 = this->constant_broadcast_type_C;
    goto LAB_00469011;
  }
  if (this->constantB == 0 || this->constantA == 0) {
    pMVar29 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pMVar26 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if (this->constantA != 0 || this->constantB != 0) {
LAB_0046935e:
      if ((long)pMVar26 - (long)pMVar29 == 0x90) {
        piVar34 = pMVar29[1].refcount;
        if (piVar34 != (int *)0x0) {
          LOCK();
          *piVar34 = *piVar34 + 1;
          UNLOCK();
        }
        pvVar21 = pMVar29[1].data;
        auVar14._0_8_ = pMVar29[1].data;
        auVar14._8_8_ = pMVar29[1].refcount;
        local_148 = auVar14._0_12_;
        ppAVar37 = &pMVar29[1].allocator;
        piVar34 = &pMVar29[1].c;
        psVar19 = &pMVar29[1].cstep;
        iVar30 = pMVar29[1].dims;
        iVar22 = pMVar29[1].w;
        iVar28 = pMVar29[1].h;
        goto LAB_00469400;
      }
    }
    if ((long)pMVar26 - (long)pMVar29 != 0xd8) {
      pAVar39 = (Allocator *)0x0;
      local_148 = SUB1612((undefined1  [16])0x0,0);
      uVar32 = 0;
      goto LAB_00469011;
    }
    piVar34 = pMVar29[2].refcount;
    if (piVar34 != (int *)0x0) {
      LOCK();
      *piVar34 = *piVar34 + 1;
      UNLOCK();
    }
    pvVar21 = pMVar29[2].data;
    auVar15._0_8_ = pMVar29[2].data;
    auVar15._8_8_ = pMVar29[2].refcount;
    local_148 = auVar15._0_12_;
    ppAVar37 = &pMVar29[2].allocator;
    piVar34 = &pMVar29[2].c;
    psVar19 = &pMVar29[2].cstep;
    iVar30 = pMVar29[2].dims;
    iVar22 = pMVar29[2].w;
    iVar28 = pMVar29[2].h;
  }
  else {
    pMVar29 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pMVar26 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if ((long)pMVar26 - (long)pMVar29 != 0x48) goto LAB_0046935e;
    piVar34 = pMVar29->refcount;
    if (piVar34 != (int *)0x0) {
      LOCK();
      *piVar34 = *piVar34 + 1;
      UNLOCK();
    }
    pvVar21 = pMVar29->data;
    auVar13._0_8_ = pMVar29->data;
    auVar13._8_8_ = pMVar29->refcount;
    local_148 = auVar13._0_12_;
    ppAVar37 = &pMVar29->allocator;
    piVar34 = &pMVar29->c;
    psVar19 = &pMVar29->cstep;
    iVar30 = pMVar29->dims;
    iVar22 = pMVar29->w;
    iVar28 = pMVar29->h;
  }
LAB_00469400:
  pAVar39 = *ppAVar37;
  uVar32 = 0;
  if ((pvVar21 != (void *)0x0) && ((long)*piVar34 * *psVar19 != 0)) {
    uVar32 = (uint)(iVar22 == iVar18 && iVar30 == 1);
    uVar40 = uVar32;
    if (iVar22 == iVar20) {
      uVar40 = 4;
    }
    if (iVar30 != 1) {
      uVar40 = uVar32;
    }
    uVar32 = 2;
    if (iVar28 != iVar18) {
      uVar32 = uVar40;
    }
    if (iVar22 != 1) {
      uVar32 = uVar40;
    }
    if (iVar30 != 2) {
      uVar32 = uVar40;
    }
    uVar40 = 3;
    if (iVar28 != iVar18) {
      uVar40 = uVar32;
    }
    if (iVar22 != iVar20) {
      uVar40 = uVar32;
    }
    if ((iVar30 == 2) && (uVar32 = uVar40, iVar28 == 1 && iVar22 == iVar20)) {
      uVar32 = 4;
    }
  }
LAB_00469011:
  iVar30 = iVar20;
  if (this->output_transpose == 0) {
    iVar30 = iVar18;
    iVar18 = iVar20;
  }
  pMVar38 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (this->output_N1M == 0) {
    Mat::create(pMVar38,iVar18,iVar30,sVar3,opt->blob_allocator);
  }
  else {
    Mat::create(pMVar38,iVar18,1,iVar30,sVar3,opt->blob_allocator);
  }
  iVar18 = -100;
  __ptr = local_148._0_8_;
  if ((pMVar38->data != (void *)0x0) && ((long)pMVar38->c * pMVar38->cstep != 0)) {
    if ((&local_c8.h)[(ulong)(local_c8.dims == 3) * 2] < 1) {
      iVar18 = 0;
    }
    else {
      fVar1 = this->alpha;
      fVar2 = this->beta;
      iVar18 = this->output_transpose;
      uVar40 = (&local_118.h)[(ulong)(local_118.dims == 3) * 2];
      iVar20 = pMVar38->dims;
      local_50 = local_c8.data;
      local_58 = local_118.data;
      local_60 = (long)(int)uVar40;
      local_40 = (ulong)(uint)(&local_c8.h)[(ulong)(local_c8.dims == 3) * 2];
      local_80 = 0;
      local_68 = &pMVar38->w;
      local_70 = &pMVar38->cstep;
      local_130 = 0;
      do {
        psVar19 = (size_t *)&local_c8.w;
        if (local_c8.dims == 3) {
          psVar19 = &local_c8.cstep;
        }
        if (0 < (int)uVar40) {
          sVar3 = *psVar19;
          psVar19 = (size_t *)&local_118.w;
          if (local_118.dims == 3) {
            psVar19 = &local_118.cstep;
          }
          psVar23 = (size_t *)local_68;
          if (iVar20 == 3) {
            psVar23 = local_70;
          }
          sVar16 = *psVar19;
          sVar17 = *psVar23;
          pvVar21 = pMVar38->data;
          local_38 = (float *)(local_148._0_8_ + local_130 * local_60 * 4);
          uVar36 = 0;
          pvVar41 = local_118.data;
          do {
            if ((float *)local_148._0_8_ == (float *)0x0) {
              fVar42 = 0.0;
            }
            else {
              pfVar24 = (float *)local_148._0_8_;
              switch(uVar32) {
              case 0:
                break;
              case 1:
              case 2:
                pfVar24 = (float *)(local_148._0_8_ + local_130 * 4);
                break;
              case 3:
                pfVar24 = local_38 + uVar36;
                break;
              case 4:
                pfVar24 = (float *)(local_148._0_8_ + uVar36 * 4);
                break;
              default:
                fVar42 = 0.0;
                goto LAB_00469289;
              }
              fVar42 = *pfVar24;
LAB_00469289:
              fVar42 = fVar42 * fVar2;
            }
            if (0 < local_c8.w) {
              uVar25 = 0;
              do {
                fVar42 = fVar42 + *(float *)((long)pvVar41 + uVar25 * 4) *
                                  *(float *)((long)local_c8.data +
                                            uVar25 * 4 + (int)sVar3 * local_80);
                uVar25 = uVar25 + 1;
              } while ((uint)local_c8.w != uVar25);
            }
            lVar31 = uVar36 * (long)(int)sVar17 * 4 + local_130 * 4;
            if (iVar18 == 0) {
              lVar31 = uVar36 * 4 + local_130 * (long)(int)sVar17 * 4;
            }
            *(float *)((long)pvVar21 + lVar31) = fVar42 * fVar1;
            uVar36 = uVar36 + 1;
            pvVar41 = (void *)((long)pvVar41 + (long)(int)sVar16 * 4);
          } while (uVar36 != uVar40);
        }
        local_130 = local_130 + 1;
        local_80 = local_80 + 4;
      } while (local_130 != local_40);
      iVar18 = 0;
      local_78 = pAVar39;
      local_48 = pMVar38;
    }
  }
  piVar34 = (int *)CONCAT44(local_148._4_4_,local_148._8_4_);
  if (piVar34 != (int *)0x0) {
    LOCK();
    *piVar34 = *piVar34 + -1;
    UNLOCK();
    if (*piVar34 == 0) {
      if (pAVar39 == (Allocator *)0x0) {
        if ((float *)__ptr != (float *)0x0) {
          free((void *)__ptr);
        }
      }
      else {
        (**(code **)(*(long *)pAVar39 + 0x18))(pAVar39);
      }
    }
  }
  piVar34 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
  if (piVar34 != (int *)0x0) {
    LOCK();
    *piVar34 = *piVar34 + -1;
    UNLOCK();
    if (*piVar34 == 0) {
      if (local_118.allocator == (Allocator *)0x0) {
        if (local_118.data != (void *)0x0) {
          free(local_118.data);
        }
      }
      else {
        (**(code **)(*(long *)local_118.allocator + 0x18))();
      }
    }
  }
  piVar34 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar34 != (int *)0x0) {
    LOCK();
    *piVar34 = *piVar34 + -1;
    UNLOCK();
    if (*piVar34 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_c8.allocator + 0x18))();
      }
    }
  }
  return iVar18;
}

Assistant:

int Gemm::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if NCNN_INT8
    if (int8_scale_term)
    {
        return forward_int8(bottom_blobs, top_blobs, opt);
    }
#endif // NCNN_INT8

    const Mat& A0 = constantA ? A_data : bottom_blobs[0];
    const Mat& B0 = constantB ? B_data : constantA ? bottom_blobs[0] : bottom_blobs[1];

    size_t elemsize = A0.elemsize;

    Mat A;
    if (transA == 0)
    {
        A = A0;
    }
    else
    {
        // transpose A to row-major
        A.create((A0.dims == 3 ? A0.c : A0.h), A0.w, elemsize, opt.workspace_allocator);

        const int A0_hstep = A0.dims == 3 ? (int)A0.cstep : A0.w;

        for (int i = 0; i < A.h; i++)
        {
            float* ptr = A.row(i);
            for (int j = 0; j < A.w; j++)
            {
                ptr[j] = A0[j * A0_hstep + i];
            }
        }
    }

    Mat BT;
    if (transB == 0)
    {
        // transpose B to col-major
        BT.create((B0.dims == 3 ? B0.c : B0.h), B0.w, elemsize, opt.workspace_allocator);

        const int B0_hstep = B0.dims == 3 ? (int)B0.cstep : B0.w;

        for (int i = 0; i < BT.h; i++)
        {
            float* ptr = BT.row(i);
            for (int j = 0; j < BT.w; j++)
            {
                ptr[j] = B0[j * B0_hstep + i];
            }
        }
    }
    else
    {
        BT = B0;
    }

    const int M = A.dims == 3 ? A.c : A.h;
    const int N = BT.dims == 3 ? BT.c : BT.h;

    Mat C;
    int broadcast_type_C = 0;
    if (constantC)
    {
        C = C_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB && bottom_blobs.size() == 1)
        {
            C = bottom_blobs[0];
        }
        else if ((constantA || constantB) && bottom_blobs.size() == 2)
        {
            C = bottom_blobs[1];
        }
        else if (bottom_blobs.size() == 3)
        {
            C = bottom_blobs[2];
        }

        if (!C.empty())
        {
            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }
        }
    }

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N, elemsize, opt.blob_allocator);
        else
            top_blob.create(M, N, elemsize, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M, elemsize, opt.blob_allocator);
        else
            top_blob.create(N, M, elemsize, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    gemm_transB(A, BT, C, top_blob, alpha, beta, broadcast_type_C, output_transpose, opt);

    return 0;
}